

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_detections.c
# Opt level: O1

void kws_detections_add(kws_detections_t *detections,char *keyphrase,int sf,int ef,int prob,int ascr
                       )

{
  int iVar1;
  undefined8 *puVar2;
  glist_t pgVar3;
  
  pgVar3 = detections->detect_list;
  while( true ) {
    if (pgVar3 == (glist_t)0x0) {
      puVar2 = (undefined8 *)
               __ckd_calloc__(1,0x18,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_detections.c"
                              ,0x4a);
      *(int *)(puVar2 + 1) = sf;
      *(int *)((long)puVar2 + 0xc) = ef;
      *puVar2 = keyphrase;
      *(int *)(puVar2 + 2) = prob;
      *(int *)((long)puVar2 + 0x14) = ascr;
      pgVar3 = glist_add_ptr(detections->detect_list,puVar2);
      detections->detect_list = pgVar3;
      return;
    }
    puVar2 = (undefined8 *)(pgVar3->data).ptr;
    iVar1 = strcmp(keyphrase,(char *)*puVar2);
    if (((iVar1 == 0) && (*(int *)(puVar2 + 1) < ef)) && (sf < *(int *)((long)puVar2 + 0xc))) break;
    pgVar3 = pgVar3->next;
  }
  if (prob <= *(int *)(puVar2 + 2)) {
    return;
  }
  *(int *)(puVar2 + 1) = sf;
  *(int *)((long)puVar2 + 0xc) = ef;
  *(int *)(puVar2 + 2) = prob;
  *(int *)((long)puVar2 + 0x14) = ascr;
  return;
}

Assistant:

void
kws_detections_add(kws_detections_t *detections, const char* keyphrase, int sf, int ef, int prob, int ascr)
{
    gnode_t *gn;
    kws_detection_t* detection;
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
        kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
        if (strcmp(keyphrase, det->keyphrase) == 0 && det->sf < ef && det->ef > sf) {
            if (det->prob < prob) {
                det->sf = sf;
                det->ef = ef;
                det->prob = prob;
                det->ascr = ascr;
            }
            return;
        }
    }

    /* Nothing found */
    detection = (kws_detection_t *)ckd_calloc(1, sizeof(*detection));
    detection->sf = sf;
    detection->ef = ef;
    detection->keyphrase = keyphrase;
    detection->prob = prob;
    detection->ascr = ascr;
    detections->detect_list = glist_add_ptr(detections->detect_list, detection);
}